

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lputil.c
# Opt level: O3

_Bool ValidateMagic(uint8_t *region,uint8_t *expected_magic,size_t magic_len)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  _Bool _Var4;
  
  _Var4 = true;
  if (magic_len != 0) {
    bVar1 = *region;
    bVar2 = *expected_magic;
    if (bVar1 == bVar2) {
      uVar3 = 0;
      do {
        if (magic_len - 1 == uVar3) {
          return true;
        }
        bVar1 = region[uVar3 + 1];
        bVar2 = expected_magic[uVar3 + 1];
        uVar3 = uVar3 + 1;
      } while (bVar1 == bVar2);
      _Var4 = magic_len <= uVar3;
    }
    else {
      _Var4 = false;
    }
    LPDebug("","(%s) %d != %d","ValidateMagic",(ulong)bVar1,(ulong)bVar2);
  }
  return _Var4;
}

Assistant:

bool
ValidateMagic(uint8_t *region, const uint8_t *expected_magic, const size_t magic_len)
{
	uint8_t *regionptr = region;

	for (int i = 0; i < magic_len; i++) {
		if (*regionptr == expected_magic[i]) {
			regionptr++;
		} else {
			LPDebug("", "(%s) %d != %d", __func__, *regionptr, expected_magic[i]);
			return false;
		}
	}

	return true;
}